

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O2

proxy * __thiscall
YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
          (proxy *__return_storage_ptr__,iterator_base<YAML::detail::iterator_value> *this)

{
  value_type local_d0;
  
  operator*(&local_d0,this);
  iterator_value::iterator_value(&__return_storage_ptr__->m_ref,&local_d0);
  iterator_value::~iterator_value(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

proxy operator->() const { return proxy(**this); }